

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ca8ed::Nrom_write_and_read_byte_cpu_bus_16k_prg_rom_Test::
~Nrom_write_and_read_byte_cpu_bus_16k_prg_rom_Test
          (Nrom_write_and_read_byte_cpu_bus_16k_prg_rom_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nrom, write_and_read_byte_cpu_bus_16k_prg_rom) {
    constexpr int kPrgRomBanks = 1;
    std::string bytes{nrom_bytes(kPrgRomBanks, 1, Mapper::Nrom)};
    set_prg_rom_byte(1, &bytes, 0x0000, 0xAB); // Mapped to 0x8000
    set_prg_rom_byte(1, &bytes, 0x3FFF, 0x10); // Mapped to 0xBFFF

    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom = RomFactory::from_bytes(ss);

    // 16 K prg rom: $C000-$FFFF should mirror $8000-$BFFF
    EXPECT_EQ(0xAB, nrom->cpu_read_byte(0x8000));
    EXPECT_EQ(0xAB, nrom->cpu_read_byte(0xC000));

    EXPECT_EQ(0x10, nrom->cpu_read_byte(0xBFFF));
    EXPECT_EQ(0x10, nrom->cpu_read_byte(0xFFFF));
}